

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

BeliefSetNonStationary * __thiscall
AlphaVectorPlanning::SampleBeliefsNonStationary(AlphaVectorPlanning *this,Arguments *args)

{
  BeliefSetNonStationary *in_RDI;
  double in_stack_00000170;
  int in_stack_00000178;
  int in_stack_0000017c;
  int in_stack_00000180;
  int in_stack_00000184;
  AlphaVectorPlanning *in_stack_00000188;
  
  SampleBeliefsNonStationary
            (in_stack_00000188,in_stack_00000184,in_stack_00000180,in_stack_0000017c,
             in_stack_00000178,in_stack_00000170);
  return in_RDI;
}

Assistant:

BeliefSetNonStationary
AlphaVectorPlanning::SampleBeliefsNonStationary(
    const ArgumentHandlers::Arguments &args) const
{
    return(SampleBeliefsNonStationary(args.nrBeliefs,
                                      args.uniqueBeliefs,
                                      args.resetAfter,
                                      args.useQMDPforSamplingBeliefs,
                                      args.QMDPexploreProb));
}